

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TextureUnitCase::render(TextureUnitCase *this,Context *context)

{
  uint uVar1;
  GLenum GVar2;
  GLenum GVar3;
  uint uVar4;
  Texture2D *this_00;
  TextureCube *this_01;
  uint uVar5;
  bool bVar6;
  int iVar7;
  deBool dVar8;
  int y;
  uint uVar9;
  uint uVar10;
  deUint32 dVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference ppTVar15;
  ConstPixelBufferAccess *pCVar16;
  void *pvVar17;
  reference ppTVar18;
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
  *pvVar19;
  reference rVar20;
  int local_26c;
  int local_218;
  Vector<float,_3> local_164;
  Vector<float,_3> local_158;
  deUint32 local_14c;
  undefined1 auStack_148 [4];
  deUint32 shaderID;
  _Bit_type local_140;
  uint local_138;
  uint local_134;
  int height_1;
  int width_1;
  ConstPixelBufferAccess access_1;
  int levelNdx_1;
  int face;
  int numLevels_1;
  bool mipmaps_1;
  TextureCube *texture_1;
  int ndxCube;
  int height;
  int width;
  ConstPixelBufferAccess access;
  int levelNdx;
  int numLevels;
  bool mipmaps;
  Texture2D *texture;
  undefined1 auStack_98 [4];
  int ndx2d;
  _Bit_type local_90;
  int local_84;
  int local_80;
  int texNdx;
  int unitNdx;
  allocator<bool> local_6a;
  bool local_69;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> isTextureSetUp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureGLNames;
  Context *context_local;
  TextureUnitCase *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  iVar7 = this->m_numTextures;
  local_69 = false;
  std::allocator<bool>::allocator(&local_6a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_68,(long)iVar7,&local_69,&local_6a);
  std::allocator<bool>::~allocator(&local_6a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,(long)this->m_numTextures);
  uVar1 = this->m_numTextures;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,0);
  (*context->_vptr_Context[7])(context,(ulong)uVar1,pvVar12);
  for (local_80 = 0; local_80 < this->m_numUnits; local_80 = local_80 + 1) {
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                        (&this->m_unitTextures,(long)local_80);
    local_84 = *pvVar13;
    (*context->_vptr_Context[4])(context,(ulong)(local_80 + 0x84c0));
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_textureTypes,(long)local_84);
    uVar1 = *pvVar12;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,(long)local_84);
    (*context->_vptr_Context[6])(context,(ulong)uVar1,(ulong)*pvVar12);
    rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_68,(long)local_84);
    _auStack_98 = rVar20;
    bVar6 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_98);
    if (((bVar6 ^ 0xffU) & 1) != 0) {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_textureTypes,(long)local_84);
      uVar1 = *pvVar12;
      pvVar14 = std::
                vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                ::operator[](&this->m_textureParams,(long)local_84);
      (*context->_vptr_Context[0x1d])(context,(ulong)uVar1,0x2802,(ulong)pvVar14->wrapModeS);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_textureTypes,(long)local_84);
      uVar1 = *pvVar12;
      pvVar14 = std::
                vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                ::operator[](&this->m_textureParams,(long)local_84);
      (*context->_vptr_Context[0x1d])(context,(ulong)uVar1,0x2803,(ulong)pvVar14->wrapModeT);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_textureTypes,(long)local_84);
      uVar1 = *pvVar12;
      pvVar14 = std::
                vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                ::operator[](&this->m_textureParams,(long)local_84);
      (*context->_vptr_Context[0x1d])(context,(ulong)uVar1,0x2801,(ulong)pvVar14->minFilter);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_textureTypes,(long)local_84);
      uVar1 = *pvVar12;
      pvVar14 = std::
                vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                ::operator[](&this->m_textureParams,(long)local_84);
      (*context->_vptr_Context[0x1d])(context,(ulong)uVar1,0x2800,(ulong)pvVar14->magFilter);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_textureTypes,(long)local_84);
      if (*pvVar12 == 0xde1) {
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->m_ndx2dOrCube,(long)local_84);
        ppTVar15 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::operator[]
                             (&this->m_textures2d,(long)*pvVar13);
        this_00 = *ppTVar15;
        iVar7 = tcu::Texture2D::getWidth(this_00);
        dVar8 = ::deIsPowerOfTwo32(iVar7);
        bVar6 = false;
        if (dVar8 != 0) {
          iVar7 = tcu::Texture2D::getHeight(this_00);
          dVar8 = ::deIsPowerOfTwo32(iVar7);
          bVar6 = dVar8 != 0;
        }
        if (bVar6) {
          iVar7 = tcu::Texture2D::getWidth(this_00);
          y = tcu::Texture2D::getHeight(this_00);
          iVar7 = de::max<int>(iVar7,y);
          local_218 = ::deLog2Floor32(iVar7);
          local_218 = local_218 + 1;
        }
        else {
          local_218 = 1;
        }
        (*context->_vptr_Context[0xf])(context,0xcf5,1);
        for (access.m_data._4_4_ = 0; (int)access.m_data._4_4_ < local_218;
            access.m_data._4_4_ = access.m_data._4_4_ + 1) {
          pCVar16 = tcu::TextureLevelPyramid::getLevel
                              (&this_00->super_TextureLevelPyramid,access.m_data._4_4_);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&height,pCVar16);
          uVar9 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&height);
          uVar10 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&height);
          uVar4 = access.m_data._4_4_;
          pvVar19 = &this->m_textureParams;
          pvVar14 = std::
                    vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                    ::operator[](pvVar19,(long)local_84);
          uVar1 = pvVar14->format;
          pvVar14 = std::
                    vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                    ::operator[](pvVar19,(long)local_84);
          GVar2 = pvVar14->format;
          pvVar14 = std::
                    vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                    ::operator[](pvVar19,(long)local_84);
          GVar3 = pvVar14->dataType;
          pvVar17 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)&height);
          (*context->_vptr_Context[0x11])
                    (context,0xde1,(ulong)uVar4,(ulong)uVar1,(ulong)uVar9,(ulong)uVar10,0,GVar2,
                     GVar3,pvVar17);
        }
      }
      else {
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->m_ndx2dOrCube,(long)local_84);
        ppTVar18 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::operator[]
                             (&this->m_texturesCube,(long)*pvVar13);
        this_01 = *ppTVar18;
        iVar7 = tcu::TextureCube::getSize(this_01);
        dVar8 = ::deIsPowerOfTwo32(iVar7);
        if (dVar8 == 0) {
          local_26c = 1;
        }
        else {
          iVar7 = tcu::TextureCube::getSize(this_01);
          local_26c = ::deLog2Floor32(iVar7);
          local_26c = local_26c + 1;
        }
        (*context->_vptr_Context[0xf])(context,0xcf5,1);
        for (access_1.m_data._4_4_ = CUBEFACE_NEGATIVE_X; (int)access_1.m_data._4_4_ < 6;
            access_1.m_data._4_4_ = access_1.m_data._4_4_ + CUBEFACE_POSITIVE_X) {
          for (access_1.m_data._0_4_ = 0; (int)(uint)access_1.m_data < local_26c;
              access_1.m_data._0_4_ = (uint)access_1.m_data + 1) {
            pCVar16 = tcu::TextureCube::getLevelFace
                                (this_01,(uint)access_1.m_data,access_1.m_data._4_4_);
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)&height_1,pCVar16);
            local_134 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&height_1);
            local_138 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&height_1);
            uVar5 = (uint)access_1.m_data;
            uVar1 = *(uint *)(s_cubeFaceTargets + (long)(int)access_1.m_data._4_4_ * 4);
            pvVar19 = &this->m_textureParams;
            pvVar14 = std::
                      vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                      ::operator[](pvVar19,(long)local_84);
            uVar10 = local_134;
            uVar9 = local_138;
            uVar4 = pvVar14->format;
            pvVar14 = std::
                      vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                      ::operator[](pvVar19,(long)local_84);
            GVar2 = pvVar14->format;
            pvVar14 = std::
                      vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                      ::operator[](pvVar19,(long)local_84);
            GVar3 = pvVar14->dataType;
            pvVar17 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)&height_1);
            (*context->_vptr_Context[0x11])
                      (context,(ulong)uVar1,(ulong)uVar5,(ulong)uVar4,(ulong)uVar10,(ulong)uVar9,0,
                       GVar2,GVar3,pvVar17);
          }
        }
      }
      rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_68,(long)local_84);
      _auStack_148 = rVar20;
      std::_Bit_reference::operator=((_Bit_reference *)auStack_148,true);
    }
  }
  dVar11 = (*context->_vptr_Context[0x79])();
  glu::checkError(dVar11,"Set textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,900);
  local_14c = (*context->_vptr_Context[0x75])(context,this->m_shader);
  (*context->_vptr_Context[0x2a])(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  MultiTexShader::setUniforms(this->m_shader,context,local_14c);
  dVar11 = local_14c;
  tcu::Vector<float,_3>::Vector(&local_158,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_164,1.0,1.0,0.0);
  sglr::drawQuad(context,dVar11,&local_158,&local_164);
  dVar11 = (*context->_vptr_Context[0x79])();
  glu::checkError(dVar11,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,0x390);
  uVar1 = this->m_numTextures;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,0);
  (*context->_vptr_Context[8])(context,(ulong)uVar1,pvVar12);
  dVar11 = (*context->_vptr_Context[0x79])();
  glu::checkError(dVar11,"Delete textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,0x395);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_68)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void TextureUnitCase::render (sglr::Context& context)
{
	// Setup textures.

	vector<deUint32>	textureGLNames;
	vector<bool>		isTextureSetUp(m_numTextures, false); // \note Same texture may be bound to multiple units, but we only want to set up parameters and data once per texture.

	textureGLNames.resize(m_numTextures);
	context.genTextures(m_numTextures, &textureGLNames[0]);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		int texNdx = m_unitTextures[unitNdx];

		// Bind texture to unit.
		context.activeTexture(GL_TEXTURE0 + unitNdx);
		context.bindTexture(m_textureTypes[texNdx], textureGLNames[texNdx]);

		if (!isTextureSetUp[texNdx])
		{
			// Binding this texture for first time, so set parameters and data.

			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_S, m_textureParams[texNdx].wrapModeS);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_T, m_textureParams[texNdx].wrapModeT);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MIN_FILTER, m_textureParams[texNdx].minFilter);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MAG_FILTER, m_textureParams[texNdx].magFilter);

			if (m_textureTypes[texNdx] == GL_TEXTURE_2D)
			{
				int						ndx2d		= m_ndx2dOrCube[texNdx];
				const tcu::Texture2D*	texture		= m_textures2d[ndx2d];
				bool					mipmaps		= (deIsPowerOfTwo32(texture->getWidth()) && deIsPowerOfTwo32(texture->getHeight()));
				int						numLevels	= mipmaps ? deLog2Floor32(de::max(texture->getWidth(), texture->getHeight()))+1 : 1;

				context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					tcu::ConstPixelBufferAccess		access	= texture->getLevel(levelNdx);
					int								width	= access.getWidth();
					int								height	= access.getHeight();

					DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

					context.texImage2D(GL_TEXTURE_2D, levelNdx, m_textureParams[texNdx].format, width, height, 0, m_textureParams[texNdx].format, m_textureParams[texNdx].dataType, access.getDataPtr());
				}
			}
			else
			{
				DE_ASSERT(m_textureTypes[texNdx] == GL_TEXTURE_CUBE_MAP);

				int							ndxCube		= m_ndx2dOrCube[texNdx];
				const tcu::TextureCube*		texture		= m_texturesCube[ndxCube];
				bool						mipmaps		= deIsPowerOfTwo32(texture->getSize()) != DE_FALSE;
				int							numLevels	= mipmaps ? deLog2Floor32(texture->getSize())+1 : 1;

				context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

				for (int face = 0; face < (int)tcu::CUBEFACE_LAST; face++)
				{
					for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
					{
						tcu::ConstPixelBufferAccess		access	= texture->getLevelFace(levelNdx, (tcu::CubeFace)face);
						int								width	= access.getWidth();
						int								height	= access.getHeight();

						DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

						context.texImage2D(s_cubeFaceTargets[face], levelNdx, m_textureParams[texNdx].format, width, height, 0, m_textureParams[texNdx].format, m_textureParams[texNdx].dataType, access.getDataPtr());
					}
				}
			}

			isTextureSetUp[texNdx] = true; // Don't set up this texture's parameters and data again later.
		}
	}

	GLU_EXPECT_NO_ERROR(context.getError(), "Set textures");

	// Setup shader

	deUint32 shaderID = context.createProgram(m_shader);

	// Draw.

	context.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_shader->setUniforms(context, shaderID);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	GLU_EXPECT_NO_ERROR(context.getError(), "Draw");

	// Delete previously generated texture names.

	context.deleteTextures(m_numTextures, &textureGLNames[0]);
	GLU_EXPECT_NO_ERROR(context.getError(), "Delete textures");
}